

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O0

bufptr __thiscall cornerstone::cluster_config::serialize(cluster_config *this)

{
  bool bVar1;
  pointer this_00;
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  srv_config *in_RSI;
  buffer *in_RDI;
  bufptr bVar2;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *__range1;
  bufptr buf;
  const_srv_itor it;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  srv_buffs;
  size_t sz;
  bufptr *result;
  pointer in_stack_ffffffffffffff38;
  type in_stack_ffffffffffffff40;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *in_stack_ffffffffffffff48;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *in_stack_ffffffffffffff50;
  _Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false> this_01;
  int32 val;
  buffer *in_stack_ffffffffffffff70;
  __normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
  local_80;
  size_t in_stack_ffffffffffffff88;
  buffer *buf_00;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  iterator local_50;
  _List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> local_48;
  iterator local_40;
  _List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> local_38;
  buffer local_30 [24];
  long local_18;
  
  local_18 = 0x14;
  this_01._M_head_impl = (_func_void_buffer_ptr *)in_RDI;
  std::
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ::vector((vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
            *)0x1aee6a);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
       ::begin((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                *)in_stack_ffffffffffffff38);
  std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::_List_const_iterator
            (&local_38,&local_40);
  while( true ) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
         ::end((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                *)in_stack_ffffffffffffff38);
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::_List_const_iterator
              (&local_48,&local_50);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
              ((_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> *)
               in_stack_ffffffffffffff40);
    std::__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1aeeed);
    srv_config::serialize(in_RSI);
    this_00 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                        ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
                         0x1aef06);
    in_stack_ffffffffffffff50 =
         (vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
          *)buffer::size(this_00);
    local_18 = (long)&(in_stack_ffffffffffffff50->
                      super__Vector_base<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_18;
    std::
    vector<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,std::allocator<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>>
    ::emplace_back<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
              ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
               in_stack_ffffffffffffff40);
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator++(&local_38);
  }
  in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
  buffer::alloc(in_stack_ffffffffffffff88);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1aefb0);
  buffer::put(in_stack_ffffffffffffff70,(ulong)in_RSI);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1aefcc);
  buffer::put(in_stack_ffffffffffffff70,(ulong)in_RSI);
  val = (int32)((ulong)in_RSI >> 0x20);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1aefe9);
  std::__cxx11::
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ::size((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
          *)in_stack_ffffffffffffff40);
  buffer::put(in_stack_ffffffffffffff70,val);
  buf_00 = local_30;
  local_80._M_current =
       (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
       std::
       vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
       ::begin((vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
                *)in_stack_ffffffffffffff38);
  std::
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ::end((vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
         *)in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
    ::operator*(&local_80);
    in_stack_ffffffffffffff38 =
         std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                   ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1af063);
    in_stack_ffffffffffffff40 =
         std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator*
                   ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
                    in_stack_ffffffffffffff40);
    buffer::put((buffer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),buf_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
    ::operator++(&local_80);
  }
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1af0ba);
  buffer::pos((buffer *)this_01._M_head_impl,(size_t)in_RDI);
  std::
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ::~vector(in_stack_ffffffffffffff50);
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this_01._M_head_impl;
  return (bufptr)bVar2._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr cluster_config::serialize()
{
    size_t sz = 2 * sz_ulong + sz_int;
    std::vector<bufptr> srv_buffs;
    for (cluster_config::const_srv_itor it = servers_.begin(); it != servers_.end(); ++it)
    {
        bufptr buf = (*it)->serialize();
        sz += buf->size();
        srv_buffs.emplace_back(std::move(buf));
    }

    bufptr result = buffer::alloc(sz);
    result->put(log_idx_);
    result->put(prev_log_idx_);
    result->put((int32)servers_.size());
    for (auto& item : srv_buffs)
    {
        result->put(*item);
    }

    result->pos(0);
    return result;
}